

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_get_keyimage(secp256k1_context *ctx,uint8_t *ki,uint8_t *pk,uint8_t *sk)

{
  int iVar1;
  int iVar2;
  int overflow;
  secp256k1_scalar s;
  secp256k1_ge ge1;
  secp256k1_gej gej1;
  secp256k1_gej gej2;
  secp256k1_fe zr [8];
  size_t clen;
  secp256k1_ge pre_a [8];
  secp256k1_gej prej [8];
  int local_dfc;
  secp256k1_scalar local_df8;
  undefined1 local_dd8 [16];
  undefined1 local_dc8 [16];
  secp256k1_strauss_state local_db0;
  secp256k1_ge local_d90;
  undefined1 local_d38 [104];
  undefined1 local_cd0 [16];
  int local_cc0;
  secp256k1_gej local_cb8;
  secp256k1_fe local_c38 [8];
  secp256k1_strauss_point_state local_af8;
  secp256k1_ge local_6e8 [8];
  secp256k1_gej local_428 [8];
  
  local_dd8 = (undefined1  [16])0x0;
  local_dc8 = (undefined1  [16])0x0;
  iVar1 = hash_to_curve(&local_d90,pk,(size_t)pk);
  iVar2 = 1;
  if (iVar1 == 0) {
    secp256k1_scalar_set_b32(&local_df8,sk,&local_dfc);
    iVar2 = 2;
    if ((local_dfc == 0) &&
       ((local_df8.d[3] != 0 || local_df8.d[1] != 0) || (local_df8.d[2] != 0 || local_df8.d[0] != 0)
       )) {
      local_cc0 = local_d90.infinity;
      local_d38._0_8_ = local_d90.x.n[0];
      local_d38._8_8_ = local_d90.x.n[1];
      local_d38._16_8_ = local_d90.x.n[2];
      local_d38._24_8_ = local_d90.x.n[3];
      local_d38._32_8_ = local_d90.x.n[4];
      local_d38._40_8_ = local_d90.y.n[0];
      local_d38._48_8_ = local_d90.y.n[1];
      local_d38._56_8_ = local_d90.y.n[2];
      local_d38._64_8_ = local_d90.y.n[3];
      local_d38._72_8_ = local_d90.y.n[4];
      local_d38._80_8_ = 1;
      local_d38._88_16_ = (undefined1  [16])0x0;
      local_cd0 = (undefined1  [16])0x0;
      local_db0.prej = local_428;
      local_db0.zr = local_c38;
      local_db0.pre_a = local_6e8;
      local_db0.ps = &local_af8;
      secp256k1_ecmult_strauss_wnaf
                (&ctx->ecmult_ctx,&local_db0,&local_cb8,1,(secp256k1_gej *)local_d38,&local_df8,
                 (secp256k1_scalar *)local_dd8);
      secp256k1_ge_set_gej(&local_d90,&local_cb8);
      secp256k1_eckey_pubkey_serialize(&local_d90,ki,(size_t *)&local_af8,1);
      iVar2 = (uint)(local_af8.wnaf_na._0_8_ != 0x21) * 3;
    }
  }
  return iVar2;
}

Assistant:

int secp256k1_get_keyimage(const secp256k1_context *ctx, uint8_t *ki, const uint8_t *pk, const uint8_t *sk)
{
    secp256k1_ge ge1;
    secp256k1_scalar s, zero;
    secp256k1_gej gej1, gej2;
    int overflow;
    size_t clen;

    secp256k1_scalar_set_int(&zero, 0);

    if (0 != hash_to_curve(&ge1, pk, 33)) { /* H(pk) */
        return 1;
    }

    secp256k1_scalar_set_b32(&s, sk, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&s)) {
        return 2;
    }

    secp256k1_gej_set_ge(&gej1, &ge1);
    secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej1, &s, &zero);  /* gej2 = H(pk) * sk */
    secp256k1_ge_set_gej(&ge1, &gej2);
    secp256k1_eckey_pubkey_serialize(&ge1, ki, &clen, 1);

    return (clen == 33) ? 0 : 3;
}